

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueCollector.h
# Opt level: O2

void __thiscall
CliqueCollector::add
          (CliqueCollector *this,unique_ptr<Clique,_std::default_delete<Clique>_> *clique,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *appearanceMap)

{
  uint uVar1;
  pointer ppAVar2;
  LogWriter *this_00;
  _func_int *p_Var3;
  AlignmentRecord *pAVar4;
  AlignmentRecord **a;
  pointer ppAVar5;
  unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
  alignments;
  AlignmentRecord *al;
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  _List_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  Clique::getAllAlignments((Clique *)local_70);
  if (this->lw != (LogWriter *)0x0) {
    local_60._16_8_ = (alignment_set_t *)0x0;
    ppAVar2 = (((_Vector_base<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_> *)
               local_70._0_8_)->_M_impl).super__Vector_impl_data._M_finish;
    local_60._0_8_ = (value_type)local_60;
    local_60._8_8_ = (value_type)local_60;
    for (ppAVar5 = (((_Vector_base<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>
                      *)local_70._0_8_)->_M_impl).super__Vector_impl_data._M_start;
        ppAVar5 != ppAVar2; ppAVar5 = ppAVar5 + 1) {
      local_70._12_4_ = AlignmentRecord::getID(*ppAVar5);
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                 (value_type_conflict1 *)(local_70 + 0xc));
    }
    this_00 = this->lw;
    uVar1 = this->id;
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
               (list<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
    LogWriter::reportClique
              (this_00,uVar1,(list<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_48);
    std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear
              ((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  }
  p_Var3 = *(_func_int **)local_70._0_8_;
  if ((ulong)((long)*(_func_int **)(local_70._0_8_ + 8) - (long)p_Var3) < 9) {
    pAVar4 = (AlignmentRecord *)operator_new(0x318);
    AlignmentRecord::AlignmentRecord(pAVar4,*(AlignmentRecord **)p_Var3);
    this->id = this->id + 1;
    local_60._0_8_ = pAVar4;
  }
  else {
    pAVar4 = (AlignmentRecord *)operator_new(0x318);
    uVar1 = this->id;
    this->id = uVar1 + 1;
    AlignmentRecord::AlignmentRecord
              (pAVar4,(unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
                       *)local_70,uVar1,appearanceMap);
    local_60._0_8_ = pAVar4;
  }
  std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::push_back
            (this->superReads,(value_type *)local_60);
  std::
  unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
                 *)local_70);
  return;
}

Assistant:

void add(std::unique_ptr<Clique> clique,std::map<std::string,int>* appearanceMap) {
        assert(clique.get() != nullptr);

//        std::cerr << "Clique " << id << std::endl;
        std::unique_ptr<std::vector<const AlignmentRecord*>> alignments = clique->getAllAlignments();

        if (lw != nullptr) {
            std::list<unsigned int> cll;            
            for (const auto& a : *alignments) {
                cll.push_back(a->getID());
            }
            lw->reportClique(this->id, cll);
        }

        AlignmentRecord* al;

        if (alignments->size() > 1) {
            al = new AlignmentRecord(alignments, this->id++,appearanceMap);
        } else {
            al = new AlignmentRecord(*(alignments->front()));
            this->id++;
        }

        superReads->push_back(al);
    }